

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLayout(bool *p_open)

{
  bool bVar1;
  undefined1 *in_RDI;
  float fVar2;
  ImVec2 *in_stack_00000008;
  ImGuiSelectableFlags in_stack_00000010;
  bool in_stack_00000017;
  char *in_stack_00000018;
  char label [128];
  int i;
  ImGuiWindowFlags in_stack_00000334;
  bool *in_stack_00000338;
  char *in_stack_00000340;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  char *in_stack_ffffffffffffff30;
  ImVec2 in_stack_ffffffffffffff38;
  ImVec2 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  uint local_1c;
  ImVec2 local_18;
  
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff0,500.0,440.0);
  ImGui::SetNextWindowSize((ImVec2 *)&stack0xfffffffffffffff0,4);
  bVar1 = ImGui::Begin(in_stack_00000340,in_stack_00000338,in_stack_00000334);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b4c,"Examples/Simple layout",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::BeginMenuBar();
    if (bVar1) {
      bVar1 = ImGui::BeginMenu(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
      if (bVar1) {
        bVar1 = ImGui::MenuItem(in_stack_ffffffffffffff30,
                                (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28
                                                ),false,false);
        if (bVar1) {
          *in_RDI = 0;
        }
        ImGui::EndMenu();
      }
      ImGui::EndMenuBar();
    }
    ImVec2::ImVec2(&local_18,150.0,0.0);
    ImGui::BeginChild((char *)in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
                      SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffff30);
    for (local_1c = 0; (int)local_1c < 100; local_1c = local_1c + 1) {
      sprintf(&stack0xffffffffffffff58,"MyObject %d",(ulong)local_1c);
      in_stack_ffffffffffffff30 = &stack0xffffffffffffff58;
      in_stack_ffffffffffffff2f = ShowExampleAppLayout::selected == local_1c;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,0.0,0.0);
      bVar1 = ImGui::Selectable(in_stack_00000018,in_stack_00000017,in_stack_00000010,
                                in_stack_00000008);
      if (bVar1) {
        ShowExampleAppLayout::selected = local_1c;
      }
    }
    ImGui::EndChild();
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                    SUB84(in_stack_ffffffffffffff30,0));
    ImGui::BeginGroup();
    fVar2 = ImGui::GetFrameHeightWithSpacing();
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,0.0,-fVar2);
    ImGui::BeginChild((char *)in_stack_ffffffffffffff40,(ImVec2 *)in_stack_ffffffffffffff38,
                      SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffff30);
    ImGui::Text("MyObject: %d",(ulong)(uint)ShowExampleAppLayout::selected);
    ImGui::Separator();
    bVar1 = ImGui::BeginTabBar(in_stack_ffffffffffffff58,(ImGuiTabBarFlags)in_stack_ffffffffffffff54
                              );
    if (bVar1) {
      bVar1 = ImGui::BeginTabItem(in_stack_ffffffffffffff58,
                                  (bool *)CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50),
                                  (ImGuiTabItemFlags)in_stack_ffffffffffffff4c);
      if (bVar1) {
        ImGui::TextWrapped(
                          "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                          );
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem(in_stack_ffffffffffffff58,
                                  (bool *)CONCAT44(in_stack_ffffffffffffff54,
                                                   in_stack_ffffffffffffff50),
                                  (ImGuiTabItemFlags)in_stack_ffffffffffffff4c);
      if (bVar1) {
        ImGui::Text("ID: 0123456789");
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
    ImGui::EndChild();
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,0.0,0.0);
    ImGui::Button(in_stack_ffffffffffffff30,
                  (ImVec2 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                    SUB84(in_stack_ffffffffffffff30,0));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff38,0.0,0.0);
    ImGui::Button(in_stack_ffffffffffffff30,
                  (ImVec2 *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    ImGui::EndGroup();
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppLayout(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(500, 440), ImGuiCond_FirstUseEver);
    if (ImGui::Begin("Example: Simple layout", p_open, ImGuiWindowFlags_MenuBar))
    {
        IMGUI_DEMO_MARKER("Examples/Simple layout");
        if (ImGui::BeginMenuBar())
        {
            if (ImGui::BeginMenu("File"))
            {
                if (ImGui::MenuItem("Close")) *p_open = false;
                ImGui::EndMenu();
            }
            ImGui::EndMenuBar();
        }

        // Left
        static int selected = 0;
        {
            ImGui::BeginChild("left pane", ImVec2(150, 0), true);
            for (int i = 0; i < 100; i++)
            {
                // FIXME: Good candidate to use ImGuiSelectableFlags_SelectOnNav
                char label[128];
                sprintf(label, "MyObject %d", i);
                if (ImGui::Selectable(label, selected == i))
                    selected = i;
            }
            ImGui::EndChild();
        }
        ImGui::SameLine();

        // Right
        {
            ImGui::BeginGroup();
            ImGui::BeginChild("item view", ImVec2(0, -ImGui::GetFrameHeightWithSpacing())); // Leave room for 1 line below us
            ImGui::Text("MyObject: %d", selected);
            ImGui::Separator();
            if (ImGui::BeginTabBar("##Tabs", ImGuiTabBarFlags_None))
            {
                if (ImGui::BeginTabItem("Description"))
                {
                    ImGui::TextWrapped("Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. ");
                    ImGui::EndTabItem();
                }
                if (ImGui::BeginTabItem("Details"))
                {
                    ImGui::Text("ID: 0123456789");
                    ImGui::EndTabItem();
                }
                ImGui::EndTabBar();
            }
            ImGui::EndChild();
            if (ImGui::Button("Revert")) {}
            ImGui::SameLine();
            if (ImGui::Button("Save")) {}
            ImGui::EndGroup();
        }
    }
    ImGui::End();
}